

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall sznet::net::EventLoop::updateChannel(EventLoop *this,Channel *channel)

{
  EventLoop *pEVar1;
  pointer pPVar2;
  Channel *channel_local;
  EventLoop *this_local;
  
  pEVar1 = Channel::ownerLoop(channel);
  if (pEVar1 == this) {
    assertInLoopThread(this);
    pPVar2 = std::unique_ptr<sznet::net::Poller,_std::default_delete<sznet::net::Poller>_>::
             operator->(&this->m_poller);
    (*pPVar2->_vptr_Poller[3])(pPVar2,channel);
    return;
  }
  __assert_fail("channel->ownerLoop() == this",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/EventLoop.cpp"
                ,0xc9,"void sznet::net::EventLoop::updateChannel(Channel *)");
}

Assistant:

void EventLoop::updateChannel(Channel* channel)
{
	assert(channel->ownerLoop() == this);
	assertInLoopThread();
	m_poller->updateChannel(channel);
}